

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_test.cc
# Opt level: O3

void anon_unknown.dwarf_68a17e::CNNTest::RunMultiOutCNNTest
               (float **input,int image_width,int image_height,int in_stride,CNN_CONFIG *cnn_config,
               CNN_THREAD_DATA *thread_data,CNN_MULTI_OUT *output,float **expected,double tolerance)

{
  int iVar1;
  float *pfVar2;
  char cVar3;
  float *pfVar4;
  _Bool _Var5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  SEARCH_METHODS *pSVar10;
  int iVar11;
  long lVar12;
  float fVar13;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  double mse;
  int *out_heights;
  int *not_used;
  int *out_widths;
  CNN_MULTI_OUT *expr2;
  char *in_stack_ffffffffffffff20;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff28;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d0;
  undefined8 *local_c8;
  AssertHelper local_c0;
  internal in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff49;
  undefined8 *in_stack_ffffffffffffff50;
  undefined8 *puVar15;
  undefined8 *puVar16;
  undefined8 in_stack_ffffffffffffff58;
  int *local_88;
  ulong local_80;
  int *local_78;
  int *local_70;
  uint local_64;
  size_t local_60;
  size_t local_58;
  int *local_50;
  float *local_48;
  long local_40;
  double local_38;
  
  local_80 = CONCAT44(local_80._4_4_,in_stride);
  sVar8 = (size_t)output->num_outputs;
  local_50 = output->output_channels;
  local_38 = tolerance;
  local_70 = (int *)aom_calloc(sVar8,4);
  local_88 = (int *)aom_calloc(sVar8,4);
  local_60 = sVar8;
  local_78 = (int *)aom_calloc(sVar8,4);
  local_d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<int*,decltype(nullptr)>
            ((internal *)&stack0xffffffffffffff48,"out_widths","nullptr",&local_70,
             &local_d0._M_head_impl);
  if (in_stack_ffffffffffffff48 == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (in_stack_ffffffffffffff50 == (undefined8 *)0x0) {
      pSVar10 = "";
    }
    else {
      pSVar10 = (SEARCH_METHODS *)*in_stack_ffffffffffffff50;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
               ,0x55,(char *)pSVar10);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff28,(Message *)&local_d0);
  }
  else {
    if (in_stack_ffffffffffffff50 != (undefined8 *)0x0) {
      puVar15 = in_stack_ffffffffffffff50;
      if ((undefined8 *)*in_stack_ffffffffffffff50 != in_stack_ffffffffffffff50 + 2) {
        operator_delete((undefined8 *)*in_stack_ffffffffffffff50);
      }
      operator_delete(in_stack_ffffffffffffff50);
      in_stack_ffffffffffffff50 = puVar15;
    }
    local_d0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperNE<int*,decltype(nullptr)>
              ((internal *)&stack0xffffffffffffff48,"out_heights","nullptr",&local_88,
               &local_d0._M_head_impl);
    if (in_stack_ffffffffffffff48 == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (in_stack_ffffffffffffff50 == (undefined8 *)0x0) {
        pSVar10 = "";
      }
      else {
        pSVar10 = (SEARCH_METHODS *)*in_stack_ffffffffffffff50;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffff28,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
                 ,0x56,(char *)pSVar10);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffff28,(Message *)&local_d0);
    }
    else {
      if (in_stack_ffffffffffffff50 != (undefined8 *)0x0) {
        puVar15 = in_stack_ffffffffffffff50;
        if ((undefined8 *)*in_stack_ffffffffffffff50 != in_stack_ffffffffffffff50 + 2) {
          operator_delete((undefined8 *)*in_stack_ffffffffffffff50);
        }
        operator_delete(in_stack_ffffffffffffff50);
        in_stack_ffffffffffffff50 = puVar15;
      }
      local_d0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::internal::CmpHelperNE<int*,decltype(nullptr)>
                ((internal *)&stack0xffffffffffffff48,"not_used","nullptr",&local_78,
                 &local_d0._M_head_impl);
      if (in_stack_ffffffffffffff48 != (internal)0x0) {
        puVar15 = in_stack_ffffffffffffff50;
        if (in_stack_ffffffffffffff50 != (undefined8 *)0x0) {
          if ((undefined8 *)*in_stack_ffffffffffffff50 != in_stack_ffffffffffffff50 + 2) {
            operator_delete((undefined8 *)*in_stack_ffffffffffffff50);
          }
          operator_delete(in_stack_ffffffffffffff50);
        }
        av1_find_cnn_output_size(image_width,image_height,cnn_config,local_70,local_88,local_78);
        expr2 = output;
        _Var5 = av1_cnn_predict_c(input,image_width,image_height,(int)local_80,cnn_config,
                                  thread_data,output);
        local_d0._M_head_impl._0_1_ = _Var5;
        local_c8 = (undefined8 *)0x0;
        if (_Var5) {
          if (0 < (int)local_60) {
            sVar8 = 0;
            lVar12 = 0;
            do {
              local_48 = expected[sVar8];
              iVar1 = local_50[sVar8];
              uVar6 = local_88[sVar8] * local_70[sVar8];
              local_d0._M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar1 < 1) {
                pbVar14 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0;
                puVar16 = puVar15;
              }
              else {
                lVar12 = (long)(int)lVar12;
                uVar7 = 0;
                pbVar14 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0;
                iVar11 = 0;
                local_58 = sVar8;
                do {
                  pfVar4 = local_48;
                  if (0 < (int)uVar6) {
                    pfVar2 = output->output_buffer[lVar12];
                    local_80 = (ulong)uVar7;
                    uVar9 = 0;
                    puVar16 = puVar15;
                    local_64 = uVar7;
                    local_40 = lVar12;
                    do {
                      testing::internal::DoubleNearPredFormat
                                (in_stack_ffffffffffffff20,(char *)expr2,
                                 (char *)in_stack_ffffffffffffff28._M_head_impl,
                                 (double)in_stack_ffffffffffffff58,(double)puVar16,
                                 (double)CONCAT71(in_stack_ffffffffffffff49,
                                                  in_stack_ffffffffffffff48));
                      if (in_stack_ffffffffffffff48 == (internal)0x0) {
                        testing::Message::Message((Message *)&stack0xffffffffffffff28);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)
                                   &((AssertHelperData *)in_stack_ffffffffffffff28._M_head_impl)->
                                    line," output ",8);
                        std::ostream::operator<<
                                  (in_stack_ffffffffffffff28._M_head_impl + 0x10,(int)local_58);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)
                                   &((AssertHelperData *)in_stack_ffffffffffffff28._M_head_impl)->
                                    line," channel ",9);
                        std::ostream::operator<<
                                  (in_stack_ffffffffffffff28._M_head_impl + 0x10,iVar11);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(in_stack_ffffffffffffff28._M_head_impl + 0x10),
                                   " pixel ",7);
                        std::ostream::operator<<
                                  (&((AssertHelperData *)in_stack_ffffffffffffff28._M_head_impl)->
                                    line,((int)local_80 + (int)uVar9) % (int)uVar6);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(in_stack_ffffffffffffff28._M_head_impl + 0x10),": ",2
                                  );
                        std::ostream::_M_insert<double>((double)pfVar4[(long)(int)uVar7 + uVar9]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)((long)in_stack_ffffffffffffff28._M_head_impl + 0x10),
                                   "/",1);
                        std::ostream::_M_insert<double>((double)pfVar2[uVar9]);
                        cVar3 = (char)in_stack_ffffffffffffff28._M_head_impl + '\x10';
                        std::ios::widen((char)*(undefined8 *)
                                               (*(long *)(in_stack_ffffffffffffff28._M_head_impl +
                                                         0x10) + -0x18) + cVar3);
                        std::ostream::put(cVar3);
                        std::ostream::flush();
                        pSVar10 = "";
                        if (puVar16 != (undefined8 *)0x0) {
                          pSVar10 = (SEARCH_METHODS *)*puVar16;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_c0,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
                                   ,0x6b,(char *)pSVar10);
                        testing::internal::AssertHelper::operator=
                                  (&local_c0,(Message *)&stack0xffffffffffffff28);
                        testing::internal::AssertHelper::~AssertHelper(&local_c0);
                        if (in_stack_ffffffffffffff28._M_head_impl !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0) {
                          (**(code **)(*(long *)in_stack_ffffffffffffff28._M_head_impl + 8))();
                        }
                      }
                      puVar15 = puVar16;
                      if (puVar16 != (undefined8 *)0x0) {
                        if ((undefined8 *)*puVar16 != puVar16 + 2) {
                          operator_delete((undefined8 *)*puVar16);
                        }
                        operator_delete(puVar16);
                      }
                      fVar13 = pfVar4[(long)(int)uVar7 + uVar9] - pfVar2[uVar9];
                      pbVar14 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)((double)(fVar13 * fVar13) + local_d0._M_head_impl);
                      uVar9 = uVar9 + 1;
                      local_d0._M_head_impl = pbVar14;
                      puVar16 = puVar15;
                    } while (uVar6 != uVar9);
                    uVar7 = local_64 + (int)uVar9;
                    lVar12 = local_40;
                  }
                  lVar12 = lVar12 + 1;
                  iVar11 = iVar11 + 1;
                  sVar8 = local_58;
                  puVar16 = puVar15;
                } while (iVar11 != iVar1);
              }
              local_d0._M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (pbVar14 / (double)(int)(uVar6 * iVar1));
              testing::internal::CmpHelperLE<double,double>
                        ((internal *)&stack0xffffffffffffff48,"mse","tolerance",(double *)&local_d0,
                         &local_38);
              if (in_stack_ffffffffffffff48 == (internal)0x0) {
                testing::Message::Message((Message *)&stack0xffffffffffffff28);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(in_stack_ffffffffffffff28._M_head_impl + 0x10)," output ",8);
                std::ostream::operator<<
                          (&((AssertHelperData *)in_stack_ffffffffffffff28._M_head_impl)->line,
                           (int)sVar8);
                cVar3 = (char)in_stack_ffffffffffffff28._M_head_impl + '\x10';
                std::ios::widen((char)*(undefined8 *)
                                       (*(long *)(in_stack_ffffffffffffff28._M_head_impl + 0x10) +
                                       -0x18) + cVar3);
                std::ostream::put(cVar3);
                std::ostream::flush();
                pSVar10 = "";
                if (puVar16 != (undefined8 *)0x0) {
                  pSVar10 = (SEARCH_METHODS *)*puVar16;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_c0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
                           ,0x76,(char *)pSVar10);
                testing::internal::AssertHelper::operator=
                          (&local_c0,(Message *)&stack0xffffffffffffff28);
                testing::internal::AssertHelper::~AssertHelper(&local_c0);
                if (in_stack_ffffffffffffff28._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)in_stack_ffffffffffffff28._M_head_impl + 8))();
                }
              }
              puVar15 = puVar16;
              if (puVar16 != (undefined8 *)0x0) {
                if ((undefined8 *)*puVar16 != puVar16 + 2) {
                  operator_delete((undefined8 *)*puVar16);
                }
                operator_delete(puVar16);
              }
              sVar8 = sVar8 + 1;
            } while (sVar8 != local_60);
          }
          aom_free(local_70);
          aom_free(local_88);
          aom_free(local_78);
          return;
        }
        testing::Message::Message((Message *)&stack0xffffffffffffff28);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&stack0xffffffffffffff48,(internal *)&local_d0,
                   (AssertionResult *)
                   "av1_cnn_predict_c(input, image_width, image_height, in_stride, cnn_config, thread_data, output)"
                   ,"false","true",(char *)thread_data);
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
                   ,0x5c,(char *)CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48));
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&stack0xffffffffffffff28);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if ((undefined1 *)CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48) !=
            &stack0xffffffffffffff58) {
          operator_delete((undefined1 *)
                          CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48));
        }
        in_stack_ffffffffffffff50 = local_c8;
        if (in_stack_ffffffffffffff28._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)in_stack_ffffffffffffff28._M_head_impl + 8))();
          in_stack_ffffffffffffff50 = local_c8;
        }
        goto LAB_004a0145;
      }
      testing::Message::Message((Message *)&local_d0);
      if (in_stack_ffffffffffffff50 == (undefined8 *)0x0) {
        pSVar10 = "";
      }
      else {
        pSVar10 = (SEARCH_METHODS *)*in_stack_ffffffffffffff50;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffff28,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
                 ,0x57,(char *)pSVar10);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffff28,(Message *)&local_d0);
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff28);
  if (local_d0._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_d0._M_head_impl + 8))();
  }
LAB_004a0145:
  if (in_stack_ffffffffffffff50 != (undefined8 *)0x0) {
    if ((undefined8 *)*in_stack_ffffffffffffff50 != in_stack_ffffffffffffff50 + 2) {
      operator_delete((undefined8 *)*in_stack_ffffffffffffff50);
    }
    operator_delete(in_stack_ffffffffffffff50);
  }
  return;
}

Assistant:

static void RunMultiOutCNNTest(const float **input, int image_width,
                                 int image_height, int in_stride,
                                 const CNN_CONFIG *cnn_config,
                                 CNN_THREAD_DATA *thread_data,
                                 CNN_MULTI_OUT *output, const float **expected,
                                 double tolerance) {
    const int num_outputs = output->num_outputs;
    const int *output_chs = output->output_channels;

    int *out_widths = (int *)aom_calloc(num_outputs, sizeof(*out_widths));
    int *out_heights = (int *)aom_calloc(num_outputs, sizeof(*out_heights));
    int *not_used = (int *)aom_calloc(num_outputs, sizeof(*not_used));
    ASSERT_NE(out_widths, nullptr);
    ASSERT_NE(out_heights, nullptr);
    ASSERT_NE(not_used, nullptr);

    av1_find_cnn_output_size(image_width, image_height, cnn_config, out_widths,
                             out_heights, not_used);
    ASSERT_TRUE(av1_cnn_predict(input, image_width, image_height, in_stride,
                                cnn_config, thread_data, output));

    int channel_offset = 0;
    for (int output_idx = 0; output_idx < num_outputs; output_idx++) {
      const float *expected_out = expected[output_idx];
      const int curr_output_chs = output_chs[output_idx];
      const int out_size = out_widths[output_idx] * out_heights[output_idx];

      double mse = 0;
      int expected_ite = 0;
      for (int channel = 0; channel < curr_output_chs; ++channel) {
        const float *buf_out = output->output_buffer[channel_offset];

        for (int i = 0; i < out_size; ++i) {
          EXPECT_NEAR(expected_out[expected_ite], buf_out[i],
                      PIXELWISE_FLOAT_TOL)
              << " output " << output_idx << " channel " << channel << " pixel "
              << expected_ite % out_size << ": " << expected_out[expected_ite]
              << "/" << buf_out[i] << std::endl;
          mse += SQR(expected_out[expected_ite] - buf_out[i]);
          expected_ite++;
        }

        channel_offset++;
      }
      mse /= (out_size * curr_output_chs);
      EXPECT_LE(mse, tolerance) << " output " << output_idx << std::endl;
    }

    aom_free(out_widths);
    aom_free(out_heights);
    aom_free(not_used);
  }